

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiViewport **ppIVar5;
  ImU32 IVar6;
  int iVar7;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar8;
  ImGuiViewportP **__dest_00;
  ImGuiViewport **__dest_01;
  int iVar9;
  int iVar10;
  
  if ((context->Initialized != false) || (context->SettingsLoaded == true)) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1030,"void ImGui::Initialize(ImGuiContext *)");
  }
  IVar6 = ImHashStr("Window",0,0);
  iVar7 = (context->SettingsHandlers).Size;
  if (iVar7 == (context->SettingsHandlers).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiSettingsHandler *)
             (*GImAllocatorAllocFunc)((long)iVar10 * 0x48,GImAllocatorUserData);
    pIVar3 = (context->SettingsHandlers).Data;
    if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
      memcpy(__dest,pIVar3,(long)(context->SettingsHandlers).Size * 0x48);
      pIVar3 = (context->SettingsHandlers).Data;
      if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (context->SettingsHandlers).Data = __dest;
    (context->SettingsHandlers).Capacity = iVar10;
    iVar7 = (context->SettingsHandlers).Size;
  }
  else {
    __dest = (context->SettingsHandlers).Data;
  }
  __dest[iVar7].TypeName = "Window";
  __dest[iVar7].TypeHash = IVar6;
  *(undefined4 *)&__dest[iVar7].field_0xc = 0;
  __dest[iVar7].ClearAllFn = WindowSettingsHandler_ClearAll;
  __dest[iVar7].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  __dest[iVar7].ReadOpenFn = WindowSettingsHandler_ReadOpen;
  __dest[iVar7].ReadLineFn = WindowSettingsHandler_ReadLine;
  __dest[iVar7].ApplyAllFn = WindowSettingsHandler_ApplyAll;
  __dest[iVar7].WriteAllFn = WindowSettingsHandler_WriteAll;
  __dest[iVar7].UserData = (void *)0x0;
  (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar8 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
  ImGuiViewportP::ImGuiViewportP(pIVar8);
  (pIVar8->super_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(pIVar8->super_ImGuiViewport).field_0x64 = 0;
  pIVar8->PlatformWindowCreated = true;
  iVar7 = (context->Viewports).Size;
  if (iVar7 == (context->Viewports).Capacity) {
    if (iVar7 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar7 / 2 + iVar7;
    }
    iVar10 = iVar7 + 1;
    if (iVar7 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
    ppIVar4 = (context->Viewports).Data;
    if (ppIVar4 != (ImGuiViewportP **)0x0) {
      memcpy(__dest_00,ppIVar4,(long)(context->Viewports).Size << 3);
      ppIVar4 = (context->Viewports).Data;
      if ((ppIVar4 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    }
    (context->Viewports).Data = __dest_00;
    (context->Viewports).Capacity = iVar10;
    iVar7 = (context->Viewports).Size;
  }
  else {
    __dest_00 = (context->Viewports).Data;
  }
  __dest_00[iVar7] = pIVar8;
  iVar7 = (context->Viewports).Size;
  (context->Viewports).Size = iVar7 + 1;
  if (-1 < iVar7) {
    pIVar8 = *(context->Viewports).Data;
    (context->PlatformIO).MainViewport = &pIVar8->super_ImGuiViewport;
    iVar7 = (context->PlatformIO).Viewports.Size;
    if (iVar7 == (context->PlatformIO).Viewports.Capacity) {
      if (iVar7 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar7 / 2 + iVar7;
      }
      iVar10 = iVar7 + 1;
      if (iVar7 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_01 = (ImGuiViewport **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData)
      ;
      ppIVar5 = (context->PlatformIO).Viewports.Data;
      if (ppIVar5 != (ImGuiViewport **)0x0) {
        memcpy(__dest_01,ppIVar5,(long)(context->PlatformIO).Viewports.Size << 3);
        ppIVar5 = (context->PlatformIO).Viewports.Data;
        if ((ppIVar5 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
      }
      (context->PlatformIO).Viewports.Data = __dest_01;
      (context->PlatformIO).Viewports.Capacity = iVar10;
      iVar7 = (context->PlatformIO).Viewports.Size;
    }
    else {
      __dest_01 = (context->PlatformIO).Viewports.Data;
    }
    __dest_01[iVar7] = &pIVar8->super_ImGuiViewport;
    pIVar2 = &(context->PlatformIO).Viewports;
    pIVar2->Size = pIVar2->Size + 1;
    DockContextInitialize(context);
    context->Initialized = true;
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,"T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    g.Viewports.push_back(viewport);
    g.PlatformIO.MainViewport = g.Viewports[0]; // Make it accessible in public-facing GetPlatformIO() immediately (before the first call to EndFrame)
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

    // Extensions
    DockContextInitialize(&g);
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}